

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::clear_memo_foreach_action(search_private *priv)

{
  v_array<Search::action_cache> *pvVar1;
  v_array<Search::action_cache> **ppvVar2;
  ulong uVar3;
  
  ppvVar2 = (priv->memo_foreach_action)._begin;
  if ((priv->memo_foreach_action)._end != ppvVar2) {
    uVar3 = 0;
    do {
      pvVar1 = ppvVar2[uVar3];
      if (pvVar1 != (v_array<Search::action_cache> *)0x0) {
        if (pvVar1->_begin != (action_cache *)0x0) {
          free(pvVar1->_begin);
        }
        pvVar1->_begin = (action_cache *)0x0;
        pvVar1->_end = (action_cache *)0x0;
        pvVar1->end_array = (action_cache *)0x0;
        pvVar1 = (priv->memo_foreach_action)._begin[uVar3];
        if (pvVar1 != (v_array<Search::action_cache> *)0x0) {
          operator_delete(pvVar1);
        }
      }
      uVar3 = uVar3 + 1;
      ppvVar2 = (priv->memo_foreach_action)._begin;
    } while (uVar3 < (ulong)((long)(priv->memo_foreach_action)._end - (long)ppvVar2 >> 3));
  }
  v_array<v_array<Search::action_cache>_*>::clear(&priv->memo_foreach_action);
  return;
}

Assistant:

void clear_memo_foreach_action(search_private& priv)
{
  for (size_t i = 0; i < priv.memo_foreach_action.size(); i++)
    if (priv.memo_foreach_action[i])
    {
      priv.memo_foreach_action[i]->delete_v();
      delete priv.memo_foreach_action[i];
    }
  priv.memo_foreach_action.clear();
}